

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::clear(ReferenceContext *this,deUint32 buffers)

{
  bool bVar1;
  uint uVar2;
  int x;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int s_1;
  int iVar6;
  int s;
  int y;
  int iVar7;
  MultisamplePixelBufferAccess access;
  IVec4 colorArea;
  Vec4 c;
  Vector<int,_4> local_f8;
  IVec4 stencilArea;
  IVec4 depthArea;
  MultisamplePixelBufferAccess stencilBuf;
  MultisamplePixelBufferAccess depthBuf;
  MultisamplePixelBufferAccess colorBuf0;
  tcu local_40 [16];
  
  if ((buffers & 0xffffbaff) != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  getDrawColorbuffer(&colorBuf0,this);
  getDrawDepthbuffer(&depthBuf,this);
  getDrawStencilbuffer(&stencilBuf,this);
  if (this->m_scissorEnabled == true) {
    tcu::Vector<int,_4>::Vector(&local_f8,&this->m_scissorBox);
  }
  else {
    local_f8.m_data[0] = 0;
    local_f8.m_data[1] = 0;
    local_f8.m_data[2] = 0x7fffffff;
    local_f8.m_data[3] = 0x7fffffff;
  }
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&access,&colorBuf0);
  c.m_data[0] = 0.0;
  c.m_data[1] = 0.0;
  intersect(&local_f8,(IVec4 *)&c);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&access,&depthBuf);
  c.m_data[0] = 0.0;
  c.m_data[1] = 0.0;
  intersect(&local_f8,(IVec4 *)&c);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&access,&stencilBuf);
  c.m_data[0] = 0.0;
  c.m_data[1] = 0.0;
  intersect(&local_f8,(IVec4 *)&c);
  if (((0x3fff < buffers) && (colorArea.m_data[2] != 0)) && (colorArea.m_data[3] != 0)) {
    rr::getSubregion(&access,&colorBuf0,colorArea.m_data[0],colorArea.m_data[1],colorArea.m_data[2],
                     colorArea.m_data[3]);
    bVar1 = tcu::isSRGB(colorBuf0.m_access.super_ConstPixelBufferAccess.m_format);
    if ((bVar1) && (this->m_sRGBUpdateEnabled == true)) {
      tcu::linearToSRGB((tcu *)&c,&this->m_clearColor);
    }
    else {
      tcu::Vector<float,_4>::Vector(&c,&this->m_clearColor);
    }
    bVar1 = (this->m_colorMask).m_data[1];
    if ((this->m_colorMask).m_data[0] == true) {
      if (((bVar1 != false) && ((this->m_colorMask).m_data[2] == true)) &&
         (((this->m_colorMask).m_data[3] & 1U) != 0)) {
        rr::clear(&access,&c);
        goto LAB_00489ca7;
      }
    }
    else if (((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) &&
            ((this->m_colorMask).m_data[3] == false)) goto LAB_00489ca7;
    for (iVar3 = 0; iVar3 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
        iVar3 = iVar3 + 1) {
      for (iVar7 = 0; iVar7 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar7 = iVar7 + 1) {
        for (iVar6 = 0; iVar6 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0];
            iVar6 = iVar6 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&stack0xffffffffffffffb0,(int)&access,iVar6,iVar7);
          tcu::select<float,4>
                    (local_40,&c,(Vector<float,_4> *)&stack0xffffffffffffffb0,&this->m_colorMask);
          tcu::PixelBufferAccess::setPixel(&access.m_access,(Vec4 *)local_40,iVar6,iVar7,iVar3);
        }
      }
    }
  }
LAB_00489ca7:
  if (((buffers >> 8 & 1) != 0 && (depthArea.m_data[3] != 0 && depthArea.m_data[2] != 0)) &&
     (this->m_depthMask == true)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&c,&depthBuf,depthArea.m_data[0],
                     depthArea.m_data[1],depthArea.m_data[2],depthArea.m_data[3]);
    getDepthMultisampleAccess(&access,(MultisamplePixelBufferAccess *)&c);
    rr::clearDepth(&access,this->m_clearDepth);
  }
  if ((buffers >> 10 & 1) != 0 && (stencilArea.m_data[2] != 0 && stencilArea.m_data[3] != 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&c,&stencilBuf,stencilArea.m_data[0],
                     stencilArea.m_data[1],stencilArea.m_data[2],stencilArea.m_data[3]);
    getStencilMultisampleAccess(&access,(MultisamplePixelBufferAccess *)&c);
    uVar2 = getNumStencilBits((TextureFormat *)&stencilBuf);
    uVar5 = -1 << ((byte)uVar2 & 0x1f);
    uVar4 = ~uVar5;
    if (0x1f < uVar2) {
      uVar4 = 0xffffffff;
    }
    uVar4 = uVar4 & this->m_clearStencil;
    if ((uVar5 | this->m_stencil[0].writeMask) == 0xffffffff) {
      rr::clearStencil(&access,uVar4);
    }
    else {
      for (iVar3 = 0; iVar3 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
          iVar3 = iVar3 + 1) {
        for (iVar7 = 0; iVar7 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
            iVar7 = iVar7 + 1) {
          for (iVar6 = 0; iVar6 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0];
              iVar6 = iVar6 + 1) {
            writeMaskedStencil(&access,iVar6,iVar7,iVar3,uVar4,this->m_stencil[0].writeMask);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clear (deUint32 buffers)
{
	RC_IF_ERROR((buffers & ~(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0, GL_INVALID_VALUE, RC_RET_VOID);

	rr::MultisamplePixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	IVec4								baseArea	= m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);
	IVec4								colorArea	= intersect(baseArea, getBufferRect(colorBuf0));
	IVec4								depthArea	= intersect(baseArea, getBufferRect(depthBuf));
	IVec4								stencilArea	= intersect(baseArea, getBufferRect(stencilBuf));
	bool								hasColor0	= !isEmpty(colorArea);
	bool								hasDepth	= !isEmpty(depthArea);
	bool								hasStencil	= !isEmpty(stencilArea);

	if (hasColor0 && (buffers & GL_COLOR_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf0, colorArea.x(), colorArea.y(), colorArea.z(), colorArea.w());
		bool								isSRGB		= tcu::isSRGB(colorBuf0.raw().getFormat());
		Vec4								c			= (isSRGB && m_sRGBUpdateEnabled) ? tcu::linearToSRGB(m_clearColor) : m_clearColor;
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];

		if (!maskUsed)
			rr::clear(access, c);
		else if (!maskZero)
		{
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						access.raw().setPixel(tcu::select(c, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
		}
		// else all channels masked out
	}

	if (hasDepth && (buffers & GL_DEPTH_BUFFER_BIT) != 0 && m_depthMask)
	{
		rr::MultisamplePixelBufferAccess access = getDepthMultisampleAccess(rr::getSubregion(depthBuf, depthArea.x(), depthArea.y(), depthArea.z(), depthArea.w()));
		rr::clearDepth(access, m_clearDepth);
	}

	if (hasStencil && (buffers & GL_STENCIL_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access					= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, stencilArea.x(), stencilArea.y(), stencilArea.z(), stencilArea.w()));
		int									stencilBits				= getNumStencilBits(stencilBuf.raw().getFormat());
		int									stencil					= maskStencil(stencilBits, m_clearStencil);

		if ((m_stencil[rr::FACETYPE_FRONT].writeMask & ((1u<<stencilBits)-1u)) != ((1u<<stencilBits)-1u))
		{
			// Slow path where depth or stencil is masked out in write.
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
		else
			rr::clearStencil(access, stencil);
	}
}